

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_manager.cpp
# Opt level: O3

void __thiscall
duckdb::DependencyManager::ReorderEntries
          (DependencyManager *this,catalog_entry_vector_t *entries,CatalogTransaction transaction)

{
  pointer prVar1;
  reference_wrapper<duckdb::CatalogEntry> *entry;
  pointer prVar2;
  catalog_entry_vector_t reordered;
  catalog_entry_set_t visited;
  vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
  local_88;
  vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
  *local_70;
  _Hashtable<std::reference_wrapper<duckdb::CatalogEntry>,_std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>,_std::__detail::_Identity,_duckdb::CatalogEntryEquality,_duckdb::CatalogEntryHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  local_88.
  super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  prVar2 = (entries->
           super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
           ).
           super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  prVar1 = (entries->
           super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
           ).
           super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (prVar2 != prVar1) {
    local_70 = &entries->
                super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
    ;
    do {
      ReorderEntry(this,transaction,prVar2->_M_data,(catalog_entry_set_t *)&local_68,
                   (catalog_entry_vector_t *)&local_88);
      prVar2 = prVar2 + 1;
    } while (prVar2 != prVar1);
    prVar2 = (local_70->
             super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    entries = (catalog_entry_vector_t *)local_70;
    if ((local_70->
        super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
        )._M_impl.super__Vector_impl_data._M_finish != prVar2) {
      (local_70->
      super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = prVar2;
    }
  }
  ::std::
  vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
  ::operator=(&entries->
               super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
              ,&local_88);
  ::std::
  _Hashtable<std::reference_wrapper<duckdb::CatalogEntry>,_std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>,_std::__detail::_Identity,_duckdb::CatalogEntryEquality,_duckdb::CatalogEntryHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_68);
  if (local_88.
      super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.
                    super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void DependencyManager::ReorderEntries(catalog_entry_vector_t &entries, CatalogTransaction transaction) {
	catalog_entry_vector_t reordered;
	catalog_entry_set_t visited;
	for (auto &entry : entries) {
		ReorderEntry(transaction, entry, visited, reordered);
	}
	// If this would fail, that means there are more entries that we somehow reached through the dependency manager
	// but those entries should not actually be visible to this transaction
	D_ASSERT(entries.size() == reordered.size());
	entries.clear();
	entries = reordered;
}